

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

OPJ_BOOL opj_pi_next(opj_pi_iterator_t *pi)

{
  OPJ_INT32 OVar1;
  OPJ_INT32 OVar2;
  OPJ_INT32 OVar3;
  OPJ_INT32 OVar4;
  OPJ_INT16 *pOVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  OPJ_UINT32 OVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  opj_pi_resolution_t *poVar19;
  opj_pi_comp_t *poVar20;
  bool bVar21;
  
  switch((pi->poc).prg) {
  case OPJ_LRCP:
    if (pi->first == 0) {
      uVar12 = pi->precno;
      goto LAB_00121ca8;
    }
    pi->first = 0;
    uVar12 = (pi->poc).layno0;
    do {
      pi->layno = uVar12;
      if ((pi->poc).layno1 <= uVar12) {
        return 0;
      }
      uVar12 = (pi->poc).resno0;
      while (pi->resno = uVar12, uVar12 < (pi->poc).resno1) {
        for (uVar12 = (pi->poc).compno0; pi->compno = uVar12, uVar12 < (pi->poc).compno1;
            uVar12 = uVar12 + 1) {
          uVar14 = pi->resno;
          if (uVar14 < pi->comps[uVar12].numresolutions) {
            if (pi->tp_on == '\0') {
              poVar19 = pi->comps[uVar12].resolutions;
              (pi->poc).precno1 = poVar19[uVar14].ph * poVar19[uVar14].pw;
            }
            for (uVar12 = (pi->poc).precno0; pi->precno = uVar12, uVar12 < (pi->poc).precno1;
                uVar12 = uVar12 + 1) {
              uVar14 = pi->step_p * uVar12 +
                       pi->step_c * pi->compno + pi->step_r * pi->resno + pi->step_l * pi->layno;
              if (pi->include_size <= uVar14) {
                return 0;
              }
              pOVar5 = pi->include;
              uVar15 = (ulong)uVar14;
              if (pOVar5[uVar15] == 0) goto LAB_00121d65;
LAB_00121ca8:
            }
            uVar12 = pi->compno;
          }
        }
        uVar12 = pi->resno + 1;
      }
      uVar12 = pi->layno + 1;
    } while( true );
  case OPJ_RLCP:
    if (pi->first == 0) {
      uVar12 = pi->precno;
      goto LAB_00121e28;
    }
    pi->first = 0;
    uVar12 = (pi->poc).resno0;
    do {
      pi->resno = uVar12;
      if ((pi->poc).resno1 <= uVar12) {
        return 0;
      }
      uVar12 = (pi->poc).layno0;
      while (pi->layno = uVar12, uVar12 < (pi->poc).layno1) {
        for (uVar12 = (pi->poc).compno0; pi->compno = uVar12, uVar12 < (pi->poc).compno1;
            uVar12 = uVar12 + 1) {
          uVar14 = pi->resno;
          if (uVar14 < pi->comps[uVar12].numresolutions) {
            if (pi->tp_on == '\0') {
              poVar19 = pi->comps[uVar12].resolutions;
              (pi->poc).precno1 = poVar19[uVar14].ph * poVar19[uVar14].pw;
            }
            for (uVar12 = (pi->poc).precno0; pi->precno = uVar12, uVar12 < (pi->poc).precno1;
                uVar12 = uVar12 + 1) {
              uVar14 = pi->step_p * uVar12 +
                       pi->step_c * pi->compno + pi->step_r * pi->resno + pi->step_l * pi->layno;
              if (pi->include_size <= uVar14) {
                return 0;
              }
              pOVar5 = pi->include;
              uVar15 = (ulong)uVar14;
              if (pOVar5[uVar15] == 0) goto LAB_00121d65;
LAB_00121e28:
            }
            uVar12 = pi->compno;
          }
        }
        uVar12 = pi->layno + 1;
      }
      uVar12 = pi->resno + 1;
    } while( true );
  case OPJ_RPCL:
    if (pi->first == 0) {
      uVar12 = pi->layno;
      goto LAB_00121e36;
    }
    pi->first = 0;
    pi->dx = 0;
    pi->dy = 0;
    uVar14 = 0;
    uVar12 = 0;
    for (uVar15 = 0; uVar15 != pi->numcomps; uVar15 = uVar15 + 1) {
      poVar20 = pi->comps + uVar15;
      uVar9 = pi->comps[uVar15].numresolutions;
      uVar17 = (ulong)uVar9;
      for (lVar16 = 0; uVar9 = uVar9 - 1, uVar17 << 4 != lVar16; lVar16 = lVar16 + 0x10) {
        poVar19 = poVar20->resolutions;
        uVar18 = *(int *)((long)&poVar19->pdx + lVar16) + uVar9;
        if (uVar18 < 0x20) {
          bVar6 = (byte)uVar18;
          if (poVar20->dx <= 0xffffffffU >> (bVar6 & 0x1f)) {
            uVar13 = poVar20->dx << (bVar6 & 0x1f);
            uVar18 = uVar13;
            if (uVar12 < uVar13) {
              uVar18 = uVar12;
            }
            bVar21 = uVar12 == 0;
            uVar12 = uVar18;
            if (bVar21) {
              uVar12 = uVar13;
            }
            pi->dx = uVar12;
          }
        }
        uVar18 = *(int *)((long)&poVar19->pdy + lVar16) + uVar9;
        if (uVar18 < 0x20) {
          bVar6 = (byte)uVar18;
          if (poVar20->dy <= 0xffffffffU >> (bVar6 & 0x1f)) {
            uVar13 = poVar20->dy << (bVar6 & 0x1f);
            uVar18 = uVar13;
            if (uVar14 < uVar13) {
              uVar18 = uVar14;
            }
            bVar21 = uVar14 == 0;
            uVar14 = uVar18;
            if (bVar21) {
              uVar14 = uVar13;
            }
            pi->dy = uVar14;
          }
        }
      }
    }
    if (uVar12 == 0) {
      return 0;
    }
    if (uVar14 == 0) {
      return 0;
    }
    if (pi->tp_on == '\0') {
      OVar1 = pi->ty0;
      OVar2 = pi->tx1;
      OVar3 = pi->ty1;
      (pi->poc).tx0 = pi->tx0;
      (pi->poc).tx1 = OVar2;
      (pi->poc).ty0 = OVar1;
      (pi->poc).ty1 = OVar3;
    }
    uVar12 = (pi->poc).resno0;
    while (pi->resno = uVar12, uVar12 < (pi->poc).resno1) {
      iVar11 = (pi->poc).ty0;
      while (pi->y = iVar11, iVar11 < (pi->poc).ty1) {
        iVar11 = (pi->poc).tx0;
        while (pi->x = iVar11, iVar11 < (pi->poc).tx1) {
          uVar12 = (pi->poc).compno0;
          while (pi->compno = uVar12, uVar12 < (pi->poc).compno1) {
            uVar14 = pi->resno;
            uVar9 = pi->comps[uVar12].numresolutions;
            if ((uVar14 < uVar9) && (uVar9 = uVar9 + ~uVar14, uVar9 < 0x20)) {
              poVar20 = pi->comps + uVar12;
              bVar6 = (byte)uVar9;
              uVar12 = poVar20->dx << (bVar6 & 0x1f);
              if ((uVar12 >> (bVar6 & 0x1f) == poVar20->dx) &&
                 ((uVar18 = poVar20->dy << (bVar6 & 0x1f), uVar18 >> (bVar6 & 0x1f) == poVar20->dy
                  && (-1 < (int)(uVar18 | uVar12))))) {
                poVar19 = poVar20->resolutions + uVar14;
                OVar1 = opj_int_ceildiv(pi->tx0,uVar12);
                OVar2 = opj_int_ceildiv(pi->ty0,poVar20->dy << (bVar6 & 0x1f));
                OVar3 = opj_int_ceildiv(pi->tx1,poVar20->dx << (bVar6 & 0x1f));
                OVar4 = opj_int_ceildiv(pi->ty1,poVar20->dy << (bVar6 & 0x1f));
                uVar12 = poVar19->pdx + uVar9;
                if (uVar12 < 0x1f) {
                  uVar14 = poVar20->dx;
                  bVar7 = (byte)uVar12;
                  if ((uVar14 <= 0xffffffffU >> (bVar7 & 0x1f)) &&
                     (uVar9 = poVar19->pdy + uVar9, uVar9 < 0x1f)) {
                    bVar8 = (byte)uVar9;
                    uVar12 = poVar20->dy << (bVar8 & 0x1f);
                    if ((((uVar12 >> (bVar8 & 0x1f) == poVar20->dy) &&
                         ((pi->y % (int)uVar12 == 0 ||
                          ((pi->y == pi->ty0 &&
                           ((OVar2 << (bVar6 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))))) &&
                        ((iVar11 = pi->x, iVar11 % (int)(uVar14 << (bVar7 & 0x1f)) == 0 ||
                         ((iVar11 == pi->tx0 &&
                          ((OVar1 << (bVar6 & 0x1f) & ~(-1 << (bVar7 & 0x1f))) != 0)))))) &&
                       ((poVar19->pw != 0 &&
                        (((poVar19->ph != 0 && (OVar1 != OVar3)) && (OVar2 != OVar4)))))) {
                      OVar3 = opj_int_ceildiv(iVar11,uVar14 << (bVar6 & 0x1f));
                      bVar7 = (byte)poVar19->pdx;
                      OVar4 = opj_int_ceildiv(pi->y,poVar20->dy << (bVar6 & 0x1f));
                      bVar6 = (byte)poVar19->pdy;
                      pi->precno = ((OVar4 >> (bVar6 & 0x1f)) - (OVar2 >> (bVar6 & 0x1f))) *
                                   poVar19->pw +
                                   ((OVar3 >> (bVar7 & 0x1f)) - (OVar1 >> (bVar7 & 0x1f)));
                      for (uVar12 = (pi->poc).layno0; pi->layno = uVar12, uVar12 < (pi->poc).layno1;
                          uVar12 = uVar12 + 1) {
                        uVar14 = pi->step_p * pi->precno +
                                 pi->step_c * pi->compno + pi->step_r * pi->resno +
                                 pi->step_l * uVar12;
                        if (pi->include_size <= uVar14) {
                          return 0;
                        }
                        pOVar5 = pi->include;
                        uVar15 = (ulong)uVar14;
                        if (pOVar5[uVar15] == 0) goto LAB_001220d9;
LAB_00121e36:
                      }
                    }
                  }
                }
              }
            }
            uVar12 = pi->compno + 1;
          }
          iVar11 = (pi->x + pi->dx) - pi->x % (int)pi->dx;
        }
        iVar11 = (pi->y + pi->dy) - pi->y % (int)pi->dy;
      }
      uVar12 = pi->resno + 1;
    }
    break;
  case OPJ_PCRL:
    if (pi->first == 0) {
      uVar12 = pi->layno;
      poVar20 = pi->comps + pi->compno;
      goto LAB_0012238e;
    }
    pi->first = 0;
    pi->dx = 0;
    pi->dy = 0;
    uVar14 = 0;
    uVar12 = 0;
    for (uVar15 = 0; uVar15 != pi->numcomps; uVar15 = uVar15 + 1) {
      poVar20 = pi->comps + uVar15;
      uVar9 = pi->comps[uVar15].numresolutions;
      uVar17 = (ulong)uVar9;
      for (lVar16 = 0; uVar9 = uVar9 - 1, uVar17 << 4 != lVar16; lVar16 = lVar16 + 0x10) {
        poVar19 = poVar20->resolutions;
        uVar18 = *(int *)((long)&poVar19->pdx + lVar16) + uVar9;
        if (uVar18 < 0x20) {
          bVar6 = (byte)uVar18;
          if (poVar20->dx <= 0xffffffffU >> (bVar6 & 0x1f)) {
            uVar13 = poVar20->dx << (bVar6 & 0x1f);
            uVar18 = uVar13;
            if (uVar12 < uVar13) {
              uVar18 = uVar12;
            }
            bVar21 = uVar12 == 0;
            uVar12 = uVar18;
            if (bVar21) {
              uVar12 = uVar13;
            }
            pi->dx = uVar12;
          }
        }
        uVar18 = *(int *)((long)&poVar19->pdy + lVar16) + uVar9;
        if (uVar18 < 0x20) {
          bVar6 = (byte)uVar18;
          if (poVar20->dy <= 0xffffffffU >> (bVar6 & 0x1f)) {
            uVar13 = poVar20->dy << (bVar6 & 0x1f);
            uVar18 = uVar13;
            if (uVar14 < uVar13) {
              uVar18 = uVar14;
            }
            bVar21 = uVar14 == 0;
            uVar14 = uVar18;
            if (bVar21) {
              uVar14 = uVar13;
            }
            pi->dy = uVar14;
          }
        }
      }
    }
    if (uVar12 == 0) {
      return 0;
    }
    if (uVar14 == 0) {
      return 0;
    }
    if (pi->tp_on == '\0') {
      OVar1 = pi->ty0;
      OVar2 = pi->tx1;
      OVar3 = pi->ty1;
      (pi->poc).tx0 = pi->tx0;
      (pi->poc).tx1 = OVar2;
      (pi->poc).ty0 = OVar1;
      (pi->poc).ty1 = OVar3;
      iVar11 = pi->ty0;
    }
    else {
      iVar11 = (pi->poc).ty0;
    }
    while (pi->y = iVar11, iVar11 < (pi->poc).ty1) {
      iVar11 = (pi->poc).tx0;
      while (pi->x = iVar11, iVar11 < (pi->poc).tx1) {
        uVar12 = (pi->poc).compno0;
        while (pi->compno = uVar12, uVar12 < (pi->poc).compno1) {
          poVar20 = pi->comps + uVar12;
          uVar12 = (pi->poc).resno0;
          while( true ) {
            pi->resno = uVar12;
            uVar14 = (pi->poc).resno1;
            uVar9 = poVar20->numresolutions;
            if (uVar9 <= uVar14) {
              uVar14 = uVar9;
            }
            if (uVar14 <= uVar12) break;
            uVar9 = uVar9 + ~uVar12;
            if (uVar9 < 0x20) {
              bVar6 = (byte)uVar9;
              uVar14 = poVar20->dx << (bVar6 & 0x1f);
              if (((uVar14 >> (bVar6 & 0x1f) == poVar20->dx) &&
                  (uVar18 = poVar20->dy << (bVar6 & 0x1f), uVar18 >> (bVar6 & 0x1f) == poVar20->dy))
                 && (-1 < (int)(uVar18 | uVar14))) {
                poVar19 = poVar20->resolutions + uVar12;
                OVar1 = opj_int_ceildiv(pi->tx0,uVar14);
                OVar2 = opj_int_ceildiv(pi->ty0,poVar20->dy << (bVar6 & 0x1f));
                OVar3 = opj_int_ceildiv(pi->tx1,poVar20->dx << (bVar6 & 0x1f));
                OVar4 = opj_int_ceildiv(pi->ty1,poVar20->dy << (bVar6 & 0x1f));
                uVar12 = poVar19->pdx + uVar9;
                if (uVar12 < 0x1f) {
                  uVar14 = poVar20->dx;
                  bVar7 = (byte)uVar12;
                  if ((uVar14 <= 0xffffffffU >> (bVar7 & 0x1f)) &&
                     (uVar9 = poVar19->pdy + uVar9, uVar9 < 0x1f)) {
                    bVar8 = (byte)uVar9;
                    uVar12 = poVar20->dy << (bVar8 & 0x1f);
                    if ((((uVar12 >> (bVar8 & 0x1f) == poVar20->dy) &&
                         ((pi->y % (int)uVar12 == 0 ||
                          ((pi->y == pi->ty0 &&
                           ((OVar2 << (bVar6 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))))) &&
                        ((iVar11 = pi->x, iVar11 % (int)(uVar14 << (bVar7 & 0x1f)) == 0 ||
                         ((iVar11 == pi->tx0 &&
                          ((OVar1 << (bVar6 & 0x1f) & ~(-1 << (bVar7 & 0x1f))) != 0)))))) &&
                       ((poVar19->pw != 0 &&
                        (((poVar19->ph != 0 && (OVar1 != OVar3)) && (OVar2 != OVar4)))))) {
                      OVar3 = opj_int_ceildiv(iVar11,uVar14 << (bVar6 & 0x1f));
                      bVar7 = (byte)poVar19->pdx;
                      OVar4 = opj_int_ceildiv(pi->y,poVar20->dy << (bVar6 & 0x1f));
                      bVar6 = (byte)poVar19->pdy;
                      pi->precno = ((OVar4 >> (bVar6 & 0x1f)) - (OVar2 >> (bVar6 & 0x1f))) *
                                   poVar19->pw +
                                   ((OVar3 >> (bVar7 & 0x1f)) - (OVar1 >> (bVar7 & 0x1f)));
                      for (uVar12 = (pi->poc).layno0; pi->layno = uVar12, uVar12 < (pi->poc).layno1;
                          uVar12 = uVar12 + 1) {
                        uVar14 = pi->step_p * pi->precno +
                                 pi->step_c * pi->compno + pi->step_r * pi->resno +
                                 pi->step_l * uVar12;
                        if (pi->include_size <= uVar14) {
                          return 0;
                        }
                        pOVar5 = pi->include;
                        uVar15 = (ulong)uVar14;
                        if (pOVar5[uVar15] == 0) goto LAB_001220d9;
LAB_0012238e:
                      }
                    }
                  }
                }
              }
            }
            uVar12 = pi->resno + 1;
          }
          uVar12 = pi->compno + 1;
        }
        iVar11 = (pi->x + pi->dx) - pi->x % (int)pi->dx;
      }
      iVar11 = (pi->y + pi->dy) - pi->y % (int)pi->dy;
    }
    break;
  case OPJ_CPRL:
    if (pi->first == 0) {
      uVar12 = pi->layno;
      poVar20 = pi->comps + pi->compno;
      goto LAB_00122717;
    }
    pi->first = 0;
    uVar12 = (pi->poc).compno0;
    while (pi->compno = uVar12, uVar12 < (pi->poc).compno1) {
      pi->dx = 0;
      pi->dy = 0;
      poVar20 = pi->comps + uVar12;
      uVar12 = pi->comps[uVar12].numresolutions;
      uVar15 = (ulong)uVar12;
      uVar14 = 0;
      OVar10 = 0;
      for (lVar16 = 0; uVar12 = uVar12 - 1, uVar15 << 4 != lVar16; lVar16 = lVar16 + 0x10) {
        poVar19 = poVar20->resolutions;
        uVar9 = *(int *)((long)&poVar19->pdx + lVar16) + uVar12;
        if (uVar9 < 0x20) {
          bVar6 = (byte)uVar9;
          if (poVar20->dx <= 0xffffffffU >> (bVar6 & 0x1f)) {
            uVar18 = poVar20->dx << (bVar6 & 0x1f);
            uVar9 = uVar18;
            if (OVar10 < uVar18) {
              uVar9 = OVar10;
            }
            bVar21 = OVar10 == 0;
            OVar10 = uVar9;
            if (bVar21) {
              OVar10 = uVar18;
            }
            pi->dx = OVar10;
          }
        }
        uVar9 = *(int *)((long)&poVar19->pdy + lVar16) + uVar12;
        if (uVar9 < 0x20) {
          bVar6 = (byte)uVar9;
          if (poVar20->dy <= 0xffffffffU >> (bVar6 & 0x1f)) {
            uVar18 = poVar20->dy << (bVar6 & 0x1f);
            uVar9 = uVar18;
            if (uVar14 < uVar18) {
              uVar9 = uVar14;
            }
            bVar21 = uVar14 == 0;
            uVar14 = uVar9;
            if (bVar21) {
              uVar14 = uVar18;
            }
            pi->dy = uVar14;
          }
        }
      }
      if (OVar10 == 0) {
        return 0;
      }
      if (uVar14 == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar1 = pi->ty0;
        OVar2 = pi->tx1;
        OVar3 = pi->ty1;
        (pi->poc).tx0 = pi->tx0;
        (pi->poc).tx1 = OVar2;
        (pi->poc).ty0 = OVar1;
        (pi->poc).ty1 = OVar3;
        iVar11 = pi->ty0;
      }
      else {
        iVar11 = (pi->poc).ty0;
      }
      while (pi->y = iVar11, iVar11 < (pi->poc).ty1) {
        iVar11 = (pi->poc).tx0;
        while (pi->x = iVar11, iVar11 < (pi->poc).tx1) {
          uVar12 = (pi->poc).resno0;
          while( true ) {
            pi->resno = uVar12;
            uVar14 = (pi->poc).resno1;
            uVar9 = poVar20->numresolutions;
            if (uVar9 <= uVar14) {
              uVar14 = uVar9;
            }
            if (uVar14 <= uVar12) break;
            uVar9 = uVar9 + ~uVar12;
            if (uVar9 < 0x20) {
              bVar6 = (byte)uVar9;
              uVar14 = poVar20->dx << (bVar6 & 0x1f);
              if (((uVar14 >> (bVar6 & 0x1f) == poVar20->dx) &&
                  (uVar18 = poVar20->dy << (bVar6 & 0x1f), uVar18 >> (bVar6 & 0x1f) == poVar20->dy))
                 && (-1 < (int)(uVar18 | uVar14))) {
                poVar19 = poVar20->resolutions + uVar12;
                OVar1 = opj_int_ceildiv(pi->tx0,uVar14);
                OVar2 = opj_int_ceildiv(pi->ty0,poVar20->dy << (bVar6 & 0x1f));
                OVar3 = opj_int_ceildiv(pi->tx1,poVar20->dx << (bVar6 & 0x1f));
                OVar4 = opj_int_ceildiv(pi->ty1,poVar20->dy << (bVar6 & 0x1f));
                uVar12 = poVar19->pdx + uVar9;
                if (uVar12 < 0x1f) {
                  uVar14 = poVar20->dx;
                  bVar7 = (byte)uVar12;
                  if ((uVar14 <= 0xffffffffU >> (bVar7 & 0x1f)) &&
                     (uVar9 = poVar19->pdy + uVar9, uVar9 < 0x1f)) {
                    bVar8 = (byte)uVar9;
                    uVar12 = poVar20->dy << (bVar8 & 0x1f);
                    if ((((uVar12 >> (bVar8 & 0x1f) == poVar20->dy) &&
                         ((pi->y % (int)uVar12 == 0 ||
                          ((pi->y == pi->ty0 &&
                           ((OVar2 << (bVar6 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))))) &&
                        ((iVar11 = pi->x, iVar11 % (int)(uVar14 << (bVar7 & 0x1f)) == 0 ||
                         ((iVar11 == pi->tx0 &&
                          ((OVar1 << (bVar6 & 0x1f) & ~(-1 << (bVar7 & 0x1f))) != 0)))))) &&
                       ((poVar19->pw != 0 &&
                        (((poVar19->ph != 0 && (OVar1 != OVar3)) && (OVar2 != OVar4)))))) {
                      OVar3 = opj_int_ceildiv(iVar11,uVar14 << (bVar6 & 0x1f));
                      bVar7 = (byte)poVar19->pdx;
                      OVar4 = opj_int_ceildiv(pi->y,poVar20->dy << (bVar6 & 0x1f));
                      bVar6 = (byte)poVar19->pdy;
                      pi->precno = ((OVar4 >> (bVar6 & 0x1f)) - (OVar2 >> (bVar6 & 0x1f))) *
                                   poVar19->pw +
                                   ((OVar3 >> (bVar7 & 0x1f)) - (OVar1 >> (bVar7 & 0x1f)));
                      for (uVar12 = (pi->poc).layno0; pi->layno = uVar12, uVar12 < (pi->poc).layno1;
                          uVar12 = uVar12 + 1) {
                        uVar14 = pi->step_p * pi->precno +
                                 pi->step_c * pi->compno + pi->step_r * pi->resno +
                                 pi->step_l * uVar12;
                        if (pi->include_size <= uVar14) {
                          return 0;
                        }
                        pOVar5 = pi->include;
                        uVar15 = (ulong)uVar14;
                        if (pOVar5[uVar15] == 0) goto LAB_001220d9;
LAB_00122717:
                      }
                    }
                  }
                }
              }
            }
            uVar12 = pi->resno + 1;
          }
          iVar11 = (pi->x + pi->dx) - pi->x % (int)pi->dx;
        }
        iVar11 = (pi->y + pi->dy) - pi->y % (int)pi->dy;
      }
      uVar12 = pi->compno + 1;
    }
  }
  return 0;
LAB_001220d9:
  pOVar5 = pOVar5 + uVar15;
  goto LAB_00121d69;
LAB_00121d65:
  pOVar5 = pOVar5 + uVar15;
LAB_00121d69:
  *pOVar5 = 1;
  return 1;
}

Assistant:

OPJ_BOOL opj_pi_next(opj_pi_iterator_t * pi)
{
    switch (pi->poc.prg) {
    case OPJ_LRCP:
        return opj_pi_next_lrcp(pi);
    case OPJ_RLCP:
        return opj_pi_next_rlcp(pi);
    case OPJ_RPCL:
        return opj_pi_next_rpcl(pi);
    case OPJ_PCRL:
        return opj_pi_next_pcrl(pi);
    case OPJ_CPRL:
        return opj_pi_next_cprl(pi);
    case OPJ_PROG_UNKNOWN:
        return OPJ_FALSE;
    }

    return OPJ_FALSE;
}